

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O0

int dbg_text(char *tgt,int min,int max,int sd)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *in_RDI;
  char sentence [257];
  int s_len;
  int needed;
  int wordlen;
  long length;
  long in_stack_fffffffffffffec8;
  long in_stack_fffffffffffffed0;
  long in_stack_fffffffffffffed8;
  long *in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffefc;
  char *in_stack_ffffffffffffff00;
  int local_24;
  char *local_8;
  
  local_24 = 0;
  dss_random(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8);
  local_8 = in_RDI;
  while( true ) {
    if (-1 < local_24) {
      *local_8 = '\0';
      return local_24;
    }
    iVar1 = txt_sentence(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    if (iVar1 < 0) break;
    iVar2 = -local_24;
    if (iVar2 < iVar1 + 1) {
      (&stack0xfffffffffffffec8)[iVar2] = 0;
      strcpy(local_8,&stack0xfffffffffffffec8);
      local_8 = local_8 + iVar2;
    }
    else {
      strcpy(local_8,&stack0xfffffffffffffec8);
      pcVar3 = local_8 + iVar1;
      iVar2 = iVar1 + 1;
      local_8 = pcVar3 + 1;
      *pcVar3 = ' ';
    }
    local_24 = iVar2 + local_24;
  }
  fprintf(_stderr,"%s","Bad sentence formation");
  abort();
}

Assistant:

int
dbg_text(char *tgt, int min, int max, int sd)
{
	long length = 0; 
	int wordlen = 0,
		needed,
		s_len;
	char sentence[MAX_SENT_LEN + 1];
	
	RANDOM(length, min, max, sd);

	while (wordlen < length)
	{
		s_len = txt_sentence(sentence, sd);
		if ( s_len < 0)
			INTERNAL_ERROR("Bad sentence formation");
		needed = length - wordlen;
		if (needed >= s_len + 1)	/* need the entire sentence */
		{
			strcpy(tgt, sentence);
			tgt += s_len;
			wordlen += s_len + 1;
			*(tgt++) = ' ';
		}
		else /* chop the new sentence off to match the length target */
		{
			sentence[needed] = '\0';
			strcpy(tgt, sentence);
			wordlen += needed;
			tgt += needed;
		}
	}
	*tgt = '\0';

	return(wordlen);
}